

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::AddTableFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::TableFunctionSet_const&>
          (duckdb *this,AlterEntryData *args,TableFunctionSet *args_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<duckdb::TableFunction,_true> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  AddTableFunctionOverloadInfo *this_01;
  AlterEntryData local_d0;
  TableFunctionSet local_68;
  
  this_01 = (AddTableFunctionOverloadInfo *)operator_new(0xb0);
  paVar1 = &local_d0.catalog.field_2;
  local_d0.catalog._M_dataplus._M_p = (args->catalog)._M_dataplus._M_p;
  paVar2 = &(args->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.catalog._M_dataplus._M_p == paVar2) {
    local_d0.catalog.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d0.catalog.field_2._8_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 8);
    local_d0.catalog.field_2._12_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 0xc);
    local_d0.catalog._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.catalog.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_d0.catalog._M_string_length = (args->catalog)._M_string_length;
  local_d0.schema._M_dataplus._M_p = (pointer)&local_d0.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar2;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->schema)._M_dataplus._M_p;
  paVar2 = &(args->schema).field_2;
  if (paVar3 == paVar2) {
    local_d0.schema.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d0.schema.field_2._8_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 8);
    local_d0.schema.field_2._12_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 0xc);
  }
  else {
    local_d0.schema.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d0.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  local_d0.schema._M_string_length = (args->schema)._M_string_length;
  paVar3 = &local_d0.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar2;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  local_d0.name._M_dataplus._M_p = (args->name)._M_dataplus._M_p;
  paVar2 = &(args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p == paVar2) {
    local_d0.name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d0.name.field_2._8_4_ = *(undefined4 *)((long)&(args->name).field_2 + 8);
    local_d0.name.field_2._12_4_ = *(undefined4 *)((long)&(args->name).field_2 + 0xc);
    local_d0.name._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d0.name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_d0.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar2;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_d0.if_not_found = args->if_not_found;
  paVar2 = &local_68.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  pcVar4 = (args_1->super_FunctionSet<duckdb::TableFunction>).name._M_dataplus._M_p;
  local_68.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar4,
             pcVar4 + (args_1->super_FunctionSet<duckdb::TableFunction>).name._M_string_length);
  this_00 = &local_68.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::vector
            (&this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &(args_1->super_FunctionSet<duckdb::TableFunction>).functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  AddTableFunctionOverloadInfo::AddTableFunctionOverloadInfo(this_01,&local_d0,&local_68);
  *(AddTableFunctionOverloadInfo **)this = this_01;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.schema._M_dataplus._M_p != &local_d0.schema.field_2) {
    operator_delete(local_d0.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.catalog._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}